

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void enable_interrupt(ixgbe_device *dev,uint16_t queue_id)

{
  long in_RDI;
  ixgbe_device *unaff_retaddr;
  uint16_t queue_id_00;
  
  if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
    queue_id_00 = (uint16_t)((ulong)in_RDI >> 0x30);
    if (*(char *)(in_RDI + 0x68) == '\x01') {
      enable_msi_interrupt(unaff_retaddr,queue_id_00);
    }
    else if (*(char *)(in_RDI + 0x68) == '\x02') {
      enable_msix_interrupt(unaff_retaddr,queue_id_00);
    }
    else {
      fprintf(_stderr,"[WARN ] %s:%d %s(): Interrupt type not supported: %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
              0xdd,"enable_interrupt",(ulong)*(byte *)(in_RDI + 0x68));
    }
  }
  return;
}

Assistant:

static void enable_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	if (!dev->ixy.interrupts.interrupts_enabled) {
		return;
	}
	switch (dev->ixy.interrupts.interrupt_type) {
		case VFIO_PCI_MSIX_IRQ_INDEX:
			enable_msix_interrupt(dev, queue_id);
			break;
		case VFIO_PCI_MSI_IRQ_INDEX:
			enable_msi_interrupt(dev, queue_id);
			break;
		default:
			warn("Interrupt type not supported: %d", dev->ixy.interrupts.interrupt_type);
			return;
	}
}